

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::BuildFieldOfTable
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,size_t offset,
          string *code_ptr)

{
  IdlNamer *pIVar1;
  BaseType BVar2;
  Parser *pPVar3;
  long *plVar4;
  size_type *psVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string field_var;
  string field_method;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string field_ty;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  size_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pIVar1 = &this->namer_;
  local_58 = offset;
  (*(this->namer_).super_Namer._vptr_Namer[7])(&local_d8,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_b8,pIVar1,field);
  GenFieldTy_abi_cxx11_(&local_78,this,field);
  if ((((this->super_BaseGenerator).parser_)->opts).python_no_type_prefix_suffix == true) {
    std::operator+(&local_98,"Add",&local_b8);
  }
  else {
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_118,pIVar1,struct_def);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138.field_2._8_8_ = plVar4[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_138._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_138,(ulong)local_b8._M_dataplus._M_p);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_98.field_2._M_allocated_capacity = *psVar5;
      local_98.field_2._8_8_ = plVar4[3];
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar5;
      local_98._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_98._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_138,"def ",&local_98);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    std::operator+(&local_f8,"(builder: flatbuffers.Builder, ",&local_d8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118.field_2._8_8_ = plVar4[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_118._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_118,(ulong)local_78._M_dataplus._M_p);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138.field_2._8_8_ = plVar4[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_138._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    uVar6 = local_f8.field_2._M_allocated_capacity;
    _Var7._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_002841b2:
      operator_delete(_Var7._M_p,uVar6 + 1);
    }
  }
  else {
    std::operator+(&local_138,"(builder, ",&local_d8);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
    uVar6 = local_138.field_2._M_allocated_capacity;
    _Var7._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) goto LAB_002841b2;
  }
  paVar8 = &local_138.field_2;
  std::__cxx11::string::append((char *)code_ptr);
  local_138._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,(anonymous_namespace)::Indent_abi_cxx11_,
             DAT_003ebf78 + (anonymous_namespace)::Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_138);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar8) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  GenMethod_abi_cxx11_(&local_118,this,field);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_138.field_2._M_allocated_capacity = *psVar5;
    local_138.field_2._8_8_ = plVar4[3];
    local_138._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar5;
    local_138._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_138._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar8) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>(&local_118,local_58);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_138.field_2._M_allocated_capacity = *psVar5;
    local_138.field_2._8_8_ = plVar4[3];
    local_138._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar5;
    local_138._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_138._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar8) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) || (struct_def->fixed != false)) {
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d8._M_dataplus._M_p);
  }
  else {
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_118,"(",&local_d8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138.field_2._8_8_ = plVar4[3];
      local_138._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_138._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar8) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)code_ptr);
  BVar2 = (field->value).type.base_type;
  if ((BVar2 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  else if (BVar2 - BASE_TYPE_FLOAT < 2) {
    FloatConstantGenerator::GenFloatConstant_abi_cxx11_
              (&local_138,&(this->float_const_gen_).super_FloatConstantGenerator,field);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar8) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_append
              ((char *)code_ptr,(ulong)(field->value).constant._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)code_ptr);
  pPVar3 = (this->super_BaseGenerator).parser_;
  if (((pPVar3->opts).one_file != false) || ((pPVar3->opts).python_no_type_prefix_suffix != false))
  goto LAB_002848b8;
  std::operator+(&local_138,"def Add",&local_b8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar8) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    std::operator+(&local_f8,"(builder: flatbuffers.Builder, ",&local_d8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118.field_2._8_8_ = plVar4[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_118._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_118,(ulong)local_78._M_dataplus._M_p);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138.field_2._8_8_ = plVar4[3];
      local_138._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_138._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar8) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_002846d1:
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::operator+(&local_138,"(builder, ",&local_d8);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
    local_f8.field_2._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
    local_f8._M_dataplus._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar8) goto LAB_002846d1;
  }
  std::__cxx11::string::append((char *)code_ptr);
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(local_50,pIVar1,struct_def);
  plVar4 = (long *)std::__cxx11::string::replace
                             ((ulong)local_50,0,(char *)0x0,(anonymous_namespace)::Indent_abi_cxx11_
                             );
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_f8.field_2._M_allocated_capacity = *psVar5;
    local_f8.field_2._8_8_ = plVar4[3];
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar5;
    local_f8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_f8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_118.field_2._M_allocated_capacity = *psVar5;
    local_118.field_2._8_8_ = plVar4[3];
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar5;
    local_118._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_118._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_118,(ulong)local_b8._M_dataplus._M_p);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_138.field_2._M_allocated_capacity = *psVar5;
    local_138.field_2._8_8_ = plVar4[3];
    local_138._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar5;
    local_138._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_138._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar8) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d8._M_dataplus._M_p);
  std::__cxx11::string::append((char *)code_ptr);
LAB_002848b8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuildFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                         const size_t offset, std::string *code_ptr) const {
    auto &code = *code_ptr;
    const std::string field_var = namer_.Variable(field);
    const std::string field_method = namer_.Method(field);
    const std::string field_ty = GenFieldTy(field);

    const auto name = parser_.opts.python_no_type_prefix_suffix
                          ? "Add" + field_method
                          : namer_.Type(struct_def) + "Add" + field_method;

    // Generate method with struct name.
    code += "def " + name;
    if (parser_.opts.python_typing) {
      code += "(builder: flatbuffers.Builder, " + field_var + ": " + field_ty;
    } else {
      code += "(builder, " + field_var;
    }
    code += "):\n";
    code += Indent + "builder.Prepend";
    code += GenMethod(field) + "Slot(";
    code += NumToString(offset) + ", ";
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.number_types.UOffsetTFlags.py_type";
      code += "(" + field_var + ")";
    } else {
      code += field_var;
    }
    code += ", ";
    if (field.IsScalarOptional()) {
      code += "None";
    } else if (IsFloat(field.value.type.base_type)) {
      code += float_const_gen_.GenFloatConstant(field);
    } else {
      code += field.value.constant;
    }
    code += ")\n\n";

    if (!parser_.opts.one_file && !parser_.opts.python_no_type_prefix_suffix) {
      // Generate method without struct name.
      code += "def Add" + field_method;
      if (parser_.opts.python_typing) {
        code += "(builder: flatbuffers.Builder, " + field_var + ": " + field_ty;
      } else {
        code += "(builder, " + field_var;
      }
      code += "):\n";
      code += Indent + namer_.Type(struct_def) + "Add" + field_method;
      code += "(builder, ";
      code += field_var;
      code += ")\n\n";
    }
  }